

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharsTrieBuilder::indexOfElementWithNextUnit
          (UCharsTrieBuilder *this,int32_t i,int32_t unitIndex,UChar unit)

{
  UChar UVar1;
  int32_t iStack_14;
  UChar unit_local;
  int32_t unitIndex_local;
  int32_t i_local;
  UCharsTrieBuilder *this_local;
  
  iStack_14 = i;
  while( true ) {
    UVar1 = UCharsTrieElement::charAt(this->elements + iStack_14,unitIndex,&this->strings);
    if (unit != UVar1) break;
    iStack_14 = iStack_14 + 1;
  }
  return iStack_14;
}

Assistant:

int32_t
UCharsTrieBuilder::indexOfElementWithNextUnit(int32_t i, int32_t unitIndex, UChar unit) const {
    while(unit==elements[i].charAt(unitIndex, strings)) {
        ++i;
    }
    return i;
}